

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O2

void print_function_name(Section *sec,unsigned_long offs)

{
  Symbol *pSVar1;
  ulong uVar2;
  FILE *__stream;
  char *pcVar3;
  uint uVar4;
  Symbol **ppSVar5;
  Symbol *pSVar6;
  Symbol *pSVar7;
  
  __stream = _stderr;
  pSVar7 = (Symbol *)0x0;
  uVar4 = 0;
  do {
    if (0x1f < (int)uVar4) {
      if ((pSVar7 != (Symbol *)0x0) && (pSVar7 != print_function_name::last_func)) {
        print_function_name::last_func = pSVar7;
        pcVar3 = getobjname(sec->obj);
        fprintf(__stream,"%s: In %s\"%s\":\n",pcVar3,
                print_function_name_infoname_rel +
                *(int *)(print_function_name_infoname_rel + (ulong)pSVar7->info * 4),pSVar7->name);
        return;
      }
      return;
    }
    ppSVar5 = sec->obj->objsyms + uVar4;
    while (pSVar1 = *ppSVar5, pSVar1 != (Symbol *)0x0) {
      pSVar6 = pSVar7;
      if ((((pSVar1->relsect == sec) && (pSVar1->info < 3)) && (pSVar1->type == '\x02')) &&
         (uVar2 = pSVar1->value, uVar2 <= offs)) {
        if ((ulong)pSVar1->size == 0) {
          pSVar6 = pSVar1;
          if (((pSVar7 != (Symbol *)0x0) && (pSVar6 = pSVar7, pSVar7->value < (long)uVar2)) &&
             ((pSVar7->bind < 2 || (1 < pSVar1->bind)))) {
            pSVar6 = pSVar1;
          }
        }
        else if (offs < uVar2 + pSVar1->size) {
          uVar4 = 0x20;
          pSVar7 = pSVar1;
          break;
        }
      }
      pSVar7 = pSVar6;
      ppSVar5 = &pSVar1->obj_chain;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void print_function_name(struct Section *sec,unsigned long offs)
/* Try to determine the function to which the section offset */
/* belongs, by comparing with SYMI_FUNC-type symbol definitions. */
/* If this was successful and the current function is different */
/* from the last one printed, make an output to stderr. */
{
  static const char *infoname[] = { "", "object ", "function " };
  static struct Symbol *last_func=NULL;
  struct Symbol *sym,*func=NULL;
  int i;

  for (i=0; i<OBJSYMHTABSIZE; i++) {  /* scan all hash chains */
    for (sym=sec->obj->objsyms[i]; sym; sym=sym->obj_chain) {
      if (sym->relsect == sec) {
        if (sym->info <= SYMI_FUNC) {
          if (sym->type == SYM_RELOC) {
            if ((unsigned long)sym->value <= offs) {
              if (sym->size) {  /* size of function specified? */
                if ((unsigned long)(sym->value+sym->size) > offs) {
                  func = sym;
                  i = OBJSYMHTABSIZE;
                  break;  /* function found! */
                }
              }
              else {  /* no size - find nearest... */
                if (func) {
                  if (sym->value > func->value) {
                    if (func->bind<SYMB_GLOBAL || sym->bind>=SYMB_GLOBAL)
                      func = sym;
                  }
                }
                else
                  func = sym;
              }
            }
          }
        }
      }
    }
  }

  /* print function name */
  if (func && func!=last_func) {
    last_func = func;
    fprintf(stderr,"%s: In %s\"%s\":\n",getobjname(sec->obj),
            infoname[func->info],func->name);
  }
}